

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::BitsToFloatCase::compare
          (BitsToFloatCase *this,void **inputs,void **outputs)

{
  StorageType_conflict value;
  reference pvVar1;
  ostream *poVar2;
  Hex<8UL> HVar3;
  Float<unsigned_int,_8,_23,_127,_3U> local_54;
  deUint64 local_50;
  deUint32 local_44;
  float local_40;
  deUint32 ulpDiff;
  float out0;
  float in0;
  int compNdx;
  deUint32 maxUlpDiff;
  int scalarSize;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  BitsToFloatCase *this_local;
  
  _scalarSize = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar1 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  maxUlpDiff = glu::VarType::getBasicType(&pvVar1->varType);
  compNdx = glu::getDataTypeScalarSize(maxUlpDiff);
  in0 = 0.0;
  out0 = 0.0;
  while( true ) {
    if (compNdx <= (int)out0) {
      return true;
    }
    ulpDiff = *(deUint32 *)((long)*outputs_local + (long)(int)out0 * 4);
    local_40 = *(float *)((long)*_scalarSize + (long)(int)out0 * 4);
    local_44 = getUlpDiff((float)ulpDiff,local_40);
    if (local_44 != 0) break;
    out0 = (float)((int)out0 + 1);
    local_44 = 0;
  }
  poVar2 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,"Expected [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)out0);
  poVar2 = std::operator<<(poVar2,"] = ");
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_54,(float)ulpDiff);
  value = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_54);
  local_50 = (deUint64)tcu::toHex<unsigned_int>(value);
  poVar2 = tcu::Format::operator<<(poVar2,(Hex<8UL>)local_50);
  poVar2 = std::operator<<(poVar2," with ULP threshold ");
  HVar3 = tcu::toHex<unsigned_int>(0);
  poVar2 = tcu::Format::operator<<(poVar2,HVar3);
  poVar2 = std::operator<<(poVar2,", got ULP diff ");
  HVar3 = tcu::toHex<unsigned_int>(local_44);
  tcu::Format::operator<<(poVar2,HVar3);
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const deUint32			maxUlpDiff		= 0;

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const deUint32	ulpDiff		= getUlpDiff(in0, out0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(tcu::Float32(in0).bits()) << " with ULP threshold "
							<< tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}